

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QRect *r)

{
  int iVar1;
  QDataStream *this;
  QDataStream *pQVar2;
  QDataStream *in_RDI;
  QDataStream *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  qint16 i;
  qint32 qVar3;
  
  iVar1 = QDataStream::version(in_RDI);
  qVar3 = (qint32)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (iVar1 == 1) {
    QRect::left((QRect *)0x629575);
    i = (qint16)((ulong)in_stack_ffffffffffffffc8 >> 0x30);
    QDataStream::operator<<(in_stack_ffffffffffffffb8,i);
    QRect::top((QRect *)0x629591);
    QDataStream::operator<<(in_stack_ffffffffffffffb8,i);
    QRect::right((QRect *)0x6295ad);
    QDataStream::operator<<(in_stack_ffffffffffffffb8,i);
    QRect::bottom((QRect *)0x6295c9);
    QDataStream::operator<<(in_stack_ffffffffffffffb8,i);
  }
  else {
    QRect::left((QRect *)0x6295ec);
    this = QDataStream::operator<<(in_stack_ffffffffffffffb8,qVar3);
    QRect::top((QRect *)0x629607);
    QDataStream::operator<<(this,qVar3);
    QRect::right((QRect *)0x629622);
    pQVar2 = QDataStream::operator<<(this,qVar3);
    qVar3 = (qint32)((ulong)pQVar2 >> 0x20);
    QRect::bottom((QRect *)0x62963d);
    QDataStream::operator<<(this,qVar3);
  }
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QRect &r)
{
    if (s.version() == 1)
        s << (qint16)r.left() << (qint16)r.top()
          << (qint16)r.right() << (qint16)r.bottom();
    else
        s << (qint32)r.left() << (qint32)r.top()
          << (qint32)r.right() << (qint32)r.bottom();
    return s;
}